

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

int open_read(char *s)

{
  FILE *pFVar1;
  FILE *f;
  char *s_local;
  
  lineno = 1;
  if (s == (char *)0x0) {
    fin = _stdin;
    fname = "stdin";
    s_local._4_4_ = 1;
  }
  else {
    pFVar1 = fl_fopen(s,"r");
    if (pFVar1 == (FILE *)0x0) {
      s_local._4_4_ = 0;
    }
    else {
      s_local._4_4_ = 1;
      fin = pFVar1;
      fname = s;
    }
  }
  return s_local._4_4_;
}

Assistant:

int open_read(const char *s) {
  lineno = 1;
  if (!s) {fin = stdin; fname = "stdin"; return 1;}
  FILE *f = fl_fopen(s,"r");
  if (!f) return 0;
  fin = f;
  fname = s;
  return 1;
}